

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O0

void __thiscall
DMovingCeiling::DMovingCeiling(DMovingCeiling *this,sector_t_conflict *sector,bool interpolate)

{
  DInterpolation *q;
  bool interpolate_local;
  sector_t_conflict *sector_local;
  DMovingCeiling *this_local;
  
  DMover::DMover(&this->super_DMover,sector);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009f4908;
  TObjPtr<DSectorEffect>::operator=(&sector->ceilingdata,(DSectorEffect *)this);
  if (interpolate) {
    q = sector_t::SetInterpolation((sector_t *)sector,0,true);
    TObjPtr<DInterpolation>::operator=(&(this->super_DMover).interpolation,q);
  }
  return;
}

Assistant:

DMovingCeiling::DMovingCeiling (sector_t *sector, bool interpolate)
	: DMover (sector)
{
	sector->ceilingdata = this;
	if (interpolate) interpolation = sector->SetInterpolation(sector_t::CeilingMove, true);
}